

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule2Test::verifyResultData
          (TessellationShaderInvarianceRule2Test *this,void **all_iterations_data)

{
  float *tessellated_vertex_data;
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  pointer p_Var4;
  reference value;
  char *__s;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  TestError *this_01;
  char *local_2e0;
  MessageBuilder local_2d8;
  undefined1 local_154 [4];
  undefined1 local_150 [4];
  _tessellation_shader_vertex_ordering ref_vertex_ordering;
  _tessellation_primitive_mode ref_primitive_mode;
  bool ref_point_mode;
  float ref_outer_tess_levels [4];
  float local_130;
  float ref_inner_tess_levels [2];
  string primitive_type;
  undefined1 local_100 [4];
  _tessellation_shader_vertex_ordering cmp_vertex_ordering;
  _tessellation_primitive_mode cmp_primitive_mode;
  bool cmp_point_mode;
  float cmp_outer_tess_levels [4];
  float local_e0;
  float local_dc;
  float cmp_inner_tess_levels [2];
  float *vertex_ptr_1;
  uint n_vertex_1;
  _vertex *ref_vertex;
  iterator iStack_b8;
  bool has_been_found;
  __normal_iterator<glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
  local_b0;
  __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
  local_a8;
  const_iterator ref_vertex_iterator;
  _vertex vertex;
  __normal_iterator<glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
  local_88;
  __normal_iterator<glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
  local_80;
  __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
  local_78;
  const_iterator vertex_iterator;
  bool has_already_been_added;
  float *vertex_ptr;
  undefined1 local_50 [4];
  uint n_vertex;
  vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> outer_vertices;
  _tessellation_primitive_mode primitive_mode;
  float *data2_ptr;
  float *data1_ptr;
  int n_primitive_type;
  void **all_iterations_data_local;
  TessellationShaderInvarianceRule2Test *this_local;
  
  data1_ptr._4_4_ = 0;
  do {
    if (1 < data1_ptr._4_4_) {
      return;
    }
    pvVar1 = all_iterations_data[data1_ptr._4_4_ << 1];
    pvVar2 = all_iterations_data[data1_ptr._4_4_ * 2 + 1];
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
    if (data1_ptr._4_4_ == 0) {
      outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES
      ;
    }
    std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::vector
              ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50);
    for (vertex_ptr._4_4_ = 0;
        vertex_ptr._4_4_ < this->m_n_tessellated_vertices[data1_ptr._4_4_ << 1];
        vertex_ptr._4_4_ = vertex_ptr._4_4_ + 1) {
      tessellated_vertex_data = (float *)((long)pvVar1 + (ulong)(vertex_ptr._4_4_ * 3) * 4);
      bVar3 = TessellationShaderUtils::isOuterEdgeVertex
                        (outer_vertices.
                         super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_,tessellated_vertex_data);
      if (bVar3) {
        vertex_iterator._M_current._3_1_ = 0;
        local_80._M_current =
             (_vertex *)
             std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::begin
                       ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50);
        __gnu_cxx::
        __normal_iterator<glcts::_vertex_const*,std::vector<glcts::_vertex,std::allocator<glcts::_vertex>>>
        ::__normal_iterator<glcts::_vertex*>
                  ((__normal_iterator<glcts::_vertex_const*,std::vector<glcts::_vertex,std::allocator<glcts::_vertex>>>
                    *)&local_78,&local_80);
        while( true ) {
          local_88._M_current =
               (_vertex *)
               std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::end
                         ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50);
          bVar3 = __gnu_cxx::operator!=(&local_78,&local_88);
          if (!bVar3) break;
          p_Var4 = __gnu_cxx::
                   __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
                   ::operator->(&local_78);
          if ((p_Var4->u == *tessellated_vertex_data) &&
             (!NAN(p_Var4->u) && !NAN(*tessellated_vertex_data))) {
            p_Var4 = __gnu_cxx::
                     __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
                     ::operator->(&local_78);
            if ((p_Var4->v == tessellated_vertex_data[1]) &&
               (!NAN(p_Var4->v) && !NAN(tessellated_vertex_data[1]))) {
              p_Var4 = __gnu_cxx::
                       __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
                       ::operator->(&local_78);
              if ((p_Var4->w == tessellated_vertex_data[2]) &&
                 (!NAN(p_Var4->w) && !NAN(tessellated_vertex_data[2]))) {
                vertex_iterator._M_current._3_1_ = 1;
                break;
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
          ::operator++(&local_78,0);
        }
        if ((vertex_iterator._M_current._3_1_ & 1) == 0) {
          _vertex::_vertex((_vertex *)((long)&ref_vertex_iterator._M_current + 4));
          ref_vertex_iterator._M_current._4_4_ = *tessellated_vertex_data;
          std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::push_back
                    ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50,
                     (value_type *)((long)&ref_vertex_iterator._M_current + 4));
        }
      }
    }
    local_b0._M_current =
         (_vertex *)
         std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::begin
                   ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50);
    __gnu_cxx::
    __normal_iterator<glcts::_vertex_const*,std::vector<glcts::_vertex,std::allocator<glcts::_vertex>>>
    ::__normal_iterator<glcts::_vertex*>
              ((__normal_iterator<glcts::_vertex_const*,std::vector<glcts::_vertex,std::allocator<glcts::_vertex>>>
                *)&local_a8,&local_b0);
    while( true ) {
      iStack_b8 = std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::end
                            ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50);
      bVar3 = __gnu_cxx::operator!=(&local_a8,&stack0xffffffffffffff48);
      if (!bVar3) break;
      bVar3 = false;
      value = __gnu_cxx::
              __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
              ::operator*(&local_a8);
      for (vertex_ptr_1._4_4_ = 0;
          vertex_ptr_1._4_4_ < this->m_n_tessellated_vertices[data1_ptr._4_4_ * 2 + 1];
          vertex_ptr_1._4_4_ = vertex_ptr_1._4_4_ + 1) {
        cmp_inner_tess_levels = (float  [2])((long)pvVar2 + (ulong)(vertex_ptr_1._4_4_ * 3) * 4);
        if ((*(float *)cmp_inner_tess_levels == value->u) &&
           (!NAN(*(float *)cmp_inner_tess_levels) && !NAN(value->u))) {
          if ((*(float *)((long)cmp_inner_tess_levels + 4) == value->v) &&
             (!NAN(*(float *)((long)cmp_inner_tess_levels + 4)) && !NAN(value->v))) {
            if ((*(float *)((long)cmp_inner_tess_levels + 8) == value->w) &&
               (!NAN(*(float *)((long)cmp_inner_tess_levels + 8)) && !NAN(value->w))) {
              bVar3 = true;
              break;
            }
          }
        }
      }
      if (!bVar3) {
        __s = "quads";
        if (data1_ptr._4_4_ == 0) {
          __s = "triangles";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(ref_inner_tess_levels + 1),__s,
                   (allocator<char> *)((long)ref_inner_tess_levels + 3));
        std::allocator<char>::~allocator((allocator<char> *)((long)ref_inner_tess_levels + 3));
        (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
          super_TestNode._vptr_TestNode[0xb])
                  (this,(ulong)(uint)(data1_ptr._4_4_ * 2),ref_outer_tess_levels + 3,
                   &ref_primitive_mode,(byte *)((long)&ref_vertex_ordering + 3),local_150,local_154,
                   0);
        (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
          super_TestNode._vptr_TestNode[0xb])
                  (this,(ulong)(data1_ptr._4_4_ * 2 + 1),&local_e0,&cmp_primitive_mode,
                   (byte *)((long)&cmp_vertex_ordering + 3),local_100,
                   (undefined1 *)((long)&primitive_type.field_2 + 0xc),0);
        this_00 = tcu::TestContext::getLog
                            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                             super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_2d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_2d8,(char (*) [13])"Outer vertex");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2afcbee);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&value->u);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&value->v);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&value->w);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a85ff4);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [60])
                                   " was not found in tessellated data coordinate set generated");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [22])" for primitive type: ");
        local_2e0 = (char *)std::__cxx11::string::c_str();
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_2e0);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [38])". Reference inner tessellation level:");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2afcbee);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,ref_outer_tess_levels + 3);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_130);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [39])"), reference outer tessellation level:");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2afcbee);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&ref_primitive_mode);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&stack0xfffffffffffffebc);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,ref_outer_tess_levels);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,ref_outer_tess_levels + 1);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [34])"), test inner tessellation level:");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2afcbee);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_dc);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [39])"), reference outer tessellation level:");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2afcbee);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&cmp_primitive_mode);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&stack0xffffffffffffff0c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,cmp_outer_tess_levels);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,cmp_outer_tess_levels + 1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c156ab);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_2d8);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,
                   "Outer edge vertex was not found in tessellated coordinate set generated for the same outer tessellation levels and vertex spacing, but different inner tessellation levels"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                   ,0x4e5);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      __gnu_cxx::
      __normal_iterator<const_glcts::_vertex_*,_std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>_>
      ::operator++(&local_a8,0);
    }
    std::vector<glcts::_vertex,_std::allocator<glcts::_vertex>_>::~vector
              ((vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> *)local_50);
    data1_ptr._4_4_ = data1_ptr._4_4_ + 1;
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule2Test::verifyResultData(const void** all_iterations_data)
{
	/* Iterate through one tessellated set of vertices for a given primitive type
	 * and identify outer vertices. Make sure exactly the same vertices can be
	 * found in the other set of vertices, generated with different input tessellation
	 * level.
	 */
	for (int n_primitive_type = 0; n_primitive_type < 2; /* triangles / quads */
		 ++n_primitive_type)
	{
		const float*				 data1_ptr		= (const float*)all_iterations_data[n_primitive_type * 2 + 0];
		const float*				 data2_ptr		= (const float*)all_iterations_data[n_primitive_type * 2 + 1];
		_tessellation_primitive_mode primitive_mode = (n_primitive_type == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
		std::vector<_vertex> outer_vertices;

		/* Iterate through all data1 vertices.. */
		for (unsigned int n_vertex = 0; n_vertex < m_n_tessellated_vertices[n_primitive_type * 2]; ++n_vertex)
		{
			/* Check if any of the components is equal to 0 or 1. If so, this could
			 * be an edge vertex.
			 */
			const float* vertex_ptr = data1_ptr + n_vertex * 3; /* components */

			if (TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, vertex_ptr))
			{
				/* Only add the vertex if it has not been added already to the vector */
				bool has_already_been_added = false;

				for (std::vector<_vertex>::const_iterator vertex_iterator = outer_vertices.begin();
					 vertex_iterator != outer_vertices.end(); vertex_iterator++)
				{
					if (vertex_iterator->u == vertex_ptr[0] && vertex_iterator->v == vertex_ptr[1] &&
						vertex_iterator->w == vertex_ptr[2])
					{
						has_already_been_added = true;

						break;
					}
				} /* for (all outer vertices stored so far) */

				if (!has_already_been_added)
				{
					_vertex vertex;

					vertex.u = vertex_ptr[0];
					vertex.v = vertex_ptr[1];
					vertex.w = vertex_ptr[2];

					outer_vertices.push_back(vertex);
				}
			} /* if (input vertex is located on outer edge) */
		}	 /* for (all input vertices) */

		DE_ASSERT(outer_vertices.size() != 0);

		/* Now that we know where outer vertices are, make sure they are present in the other data set */
		for (std::vector<_vertex>::const_iterator ref_vertex_iterator = outer_vertices.begin();
			 ref_vertex_iterator != outer_vertices.end(); ref_vertex_iterator++)
		{
			bool		   has_been_found = false;
			const _vertex& ref_vertex	 = *ref_vertex_iterator;

			for (unsigned int n_vertex = 0; n_vertex < m_n_tessellated_vertices[n_primitive_type * 2 + 1]; ++n_vertex)
			{
				const float* vertex_ptr = data2_ptr + n_vertex * 3; /* components */

				if (vertex_ptr[0] == ref_vertex.u && vertex_ptr[1] == ref_vertex.v && vertex_ptr[2] == ref_vertex.w)
				{
					has_been_found = true;

					break;
				}
			} /* for (all vertices in the other data set) */

			if (!has_been_found)
			{
				float								 cmp_inner_tess_levels[2];
				float								 cmp_outer_tess_levels[4];
				bool								 cmp_point_mode;
				_tessellation_primitive_mode		 cmp_primitive_mode;
				_tessellation_shader_vertex_ordering cmp_vertex_ordering;
				std::string							 primitive_type = (n_primitive_type == 0) ? "triangles" : "quads";
				float								 ref_inner_tess_levels[2];
				float								 ref_outer_tess_levels[4];
				bool								 ref_point_mode;
				_tessellation_primitive_mode		 ref_primitive_mode;
				_tessellation_shader_vertex_ordering ref_vertex_ordering;

				getIterationProperties(n_primitive_type * 2, ref_inner_tess_levels, ref_outer_tess_levels,
									   &ref_point_mode, &ref_primitive_mode, &ref_vertex_ordering, NULL);
				getIterationProperties(n_primitive_type * 2 + 1, cmp_inner_tess_levels, cmp_outer_tess_levels,
									   &cmp_point_mode, &cmp_primitive_mode, &cmp_vertex_ordering, NULL);

				m_testCtx.getLog() << tcu::TestLog::Message << "Outer vertex"
								   << " (" << ref_vertex.u << ", " << ref_vertex.v << ", " << ref_vertex.w << ")"
								   << " was not found in tessellated data coordinate set generated"
								   << " for primitive type: " << primitive_type.c_str()
								   << ". Reference inner tessellation level:"
								   << " (" << ref_inner_tess_levels[0] << ", " << ref_inner_tess_levels[1]
								   << "), reference outer tessellation level:"
								   << " (" << ref_outer_tess_levels[0] << ", " << ref_outer_tess_levels[1] << ", "
								   << ref_outer_tess_levels[2] << ", " << ref_outer_tess_levels[3]
								   << "), test inner tessellation level:"
								   << " (" << cmp_inner_tess_levels[0] << ", " << cmp_inner_tess_levels[1]
								   << "), reference outer tessellation level:"
								   << " (" << cmp_outer_tess_levels[0] << ", " << cmp_outer_tess_levels[1] << ", "
								   << cmp_outer_tess_levels[2] << ", " << cmp_outer_tess_levels[3] << ")."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Outer edge vertex was not found in tessellated coordinate set generated for "
						 "the same outer tessellation levels and vertex spacing, but different inner "
						 "tessellation levels");
			} /* if (outer edge vertex was not found in the other set) */
		}	 /* for (all outer edge vertices) */
	}		  /* for (both primitive types) */
}